

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O0

void __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::dump
          (iterator *this,ostream *os)

{
  bool bVar1;
  _Setfill<char> _Var2;
  key_prefix_size kVar3;
  node_type nVar4;
  _Setw _Var5;
  reference node;
  ostream *poVar6;
  undefined8 uVar7;
  void *pvVar8;
  __extent_storage<18446744073709551615UL> in_RCX;
  span<const_std::byte,_18446744073709551615UL> key;
  span<const_std::byte,_18446744073709551615UL> key_00;
  key_view kVar9;
  ostream *local_c0;
  __extent_storage<18446744073709551615UL> local_b8;
  node_ptr *np;
  value_type *e;
  ulong local_80;
  size_type level;
  stack<unodb::detail::iter_result<unodb::detail::node_header>,_std::deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>_>
  tmp;
  __extent_storage<18446744073709551615UL> local_20;
  ostream *os_local;
  iterator *this_local;
  
  bVar1 = empty(this);
  if (bVar1) {
    std::operator<<(os,"iter::stack:: empty\n");
  }
  else {
    std::operator<<(os,"keybuf=");
    join_0x00000010_0x00000000_ = detail::key_buffer::get_key_view(&this->keybuf_);
    key._M_extent._M_extent_value = in_RCX._M_extent_value;
    key._M_ptr = (pointer)local_20._M_extent_value;
    detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
              ((detail *)os,
               (ostream *)
               tmp.c.
               super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node,key);
    std::operator<<(os,"\n");
    std::
    stack<unodb::detail::iter_result<unodb::detail::node_header>,_std::deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>_>
    ::stack((stack<unodb::detail::iter_result<unodb::detail::node_header>,_std::deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>_>
             *)&level,&this->stack_);
    local_80 = std::
               stack<unodb::detail::iter_result<unodb::detail::node_header>,_std::deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>_>
               ::size((stack<unodb::detail::iter_result<unodb::detail::node_header>,_std::deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>_>
                       *)&level);
    while( true ) {
      local_80 = local_80 - 1;
      bVar1 = std::
              stack<unodb::detail::iter_result<unodb::detail::node_header>,_std::deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>_>
              ::empty((stack<unodb::detail::iter_result<unodb::detail::node_header>,_std::deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>_>
                       *)&level);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      node = std::
             stack<unodb::detail::iter_result<unodb::detail::node_header>,_std::deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>_>
             ::top((stack<unodb::detail::iter_result<unodb::detail::node_header>,_std::deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>_>
                    *)&level);
      poVar6 = std::operator<<(os,"iter::stack:: level = ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_80);
      poVar6 = std::operator<<(poVar6,", key_byte=0x");
      uVar7 = std::ostream::operator<<(poVar6,std::hex);
      _Var2 = std::setfill<char>('0');
      poVar6 = std::operator<<(uVar7,_Var2._M_c);
      _Var5 = std::setw(2);
      poVar6 = std::operator<<(poVar6,_Var5);
      pvVar8 = (void *)std::ostream::operator<<(poVar6,(ulong)node->key_byte);
      poVar6 = (ostream *)std::ostream::operator<<(pvVar8,std::dec);
      poVar6 = std::operator<<(poVar6,", child_index=0x");
      uVar7 = std::ostream::operator<<(poVar6,std::hex);
      _Var2 = std::setfill<char>('0');
      poVar6 = std::operator<<(uVar7,_Var2._M_c);
      _Var5 = std::setw(2);
      poVar6 = std::operator<<(poVar6,_Var5);
      pvVar8 = (void *)std::ostream::operator<<(poVar6,(ulong)node->child_index);
      poVar6 = (ostream *)std::ostream::operator<<(pvVar8,std::dec);
      poVar6 = std::operator<<(poVar6,", prefix(");
      kVar3 = detail::key_prefix_snapshot::length((key_prefix_snapshot *)&(node->prefix).f);
      poVar6 = std::operator<<(poVar6,kVar3);
      std::operator<<(poVar6,")=");
      kVar9 = detail::key_prefix_snapshot::get_key_view((key_prefix_snapshot *)&(node->prefix).f);
      local_c0 = (ostream *)kVar9._M_ptr;
      local_b8 = kVar9._M_extent._M_extent_value;
      key_00._M_extent._M_extent_value = in_RCX._M_extent_value;
      key_00._M_ptr = (pointer)local_b8._M_extent_value;
      detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
                ((detail *)os,local_c0,key_00);
      std::operator<<(os,", ");
      detail::
      basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>
      ::dump_node(os,&node->node,false);
      nVar4 = detail::basic_node_ptr<unodb::detail::node_header>::type(&node->node);
      if (nVar4 != LEAF) {
        std::operator<<(os,'\n');
      }
      std::
      stack<unodb::detail::iter_result<unodb::detail::node_header>,_std::deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>_>
      ::pop((stack<unodb::detail::iter_result<unodb::detail::node_header>,_std::deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>_>
             *)&level);
    }
    std::
    stack<unodb::detail::iter_result<unodb::detail::node_header>,_std::deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>_>
    ::~stack((stack<unodb::detail::iter_result<unodb::detail::node_header>,_std::deque<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>_>
              *)&level);
  }
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump(std::ostream& os) const {
      if (empty()) {
        os << "iter::stack:: empty\n";
        return;
      }
      // Dump the key buffer maintained by the iterator.
      os << "keybuf=";
      detail::dump_key(os, keybuf_.get_key_view());
      os << "\n";
      // Create a new stack and copy everything there.  Using the new
      // stack, print out the stack in top-bottom order.  This avoids
      // modifications to the existing stack for the iterator.
      auto tmp = stack_;
      auto level = tmp.size() - 1;
      while (!tmp.empty()) {
        const auto& e = tmp.top();
        const auto& np = e.node;
        os << "iter::stack:: level = " << level << ", key_byte=0x" << std::hex
           << std::setfill('0') << std::setw(2)
           << static_cast<std::uint64_t>(e.key_byte) << std::dec
           << ", child_index=0x" << std::hex << std::setfill('0')
           << std::setw(2) << static_cast<std::uint64_t>(e.child_index)
           << std::dec << ", prefix(" << e.prefix.length() << ")=";
        detail::dump_key(os, e.prefix.get_key_view());
        os << ", ";
        art_policy::dump_node(os, np, false /*recursive*/);
        if (np.type() != node_type::LEAF) os << '\n';
        tmp.pop();
        level--;
      }
    }